

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmTarget * __thiscall
cmMakefile::AddImportedTarget(cmMakefile *this,string *name,TargetType type,bool global)

{
  pointer *pppcVar1;
  iterator __position;
  auto_ptr<cmTarget> aVar2;
  cmTarget *this_00;
  mapped_type *ppcVar3;
  auto_ptr<cmTarget> target;
  auto_ptr<cmTarget> local_38;
  cmTarget *local_30;
  
  this_00 = (cmTarget *)operator_new(0x328);
  cmTarget::cmTarget(this_00);
  local_38.x_ = this_00;
  cmTarget::SetType(this_00,type,name);
  cmTarget::MarkAsImported(local_38.x_);
  cmTarget::SetMakefile(local_38.x_,this);
  aVar2.x_ = local_38.x_;
  ppcVar3 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->ImportedTargets,name);
  *ppcVar3 = aVar2.x_;
  if (global) {
    cmGlobalGenerator::AddTarget(this->LocalGenerator->GlobalGenerator,local_38.x_);
  }
  local_30 = local_38.x_;
  __position._M_current =
       (this->ImportedTargetsOwned).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ImportedTargetsOwned).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmTarget*,std::allocator<cmTarget*>>::_M_realloc_insert<cmTarget*>
              ((vector<cmTarget*,std::allocator<cmTarget*>> *)&this->ImportedTargetsOwned,__position
               ,&local_30);
  }
  else {
    *__position._M_current = local_38.x_;
    pppcVar1 = &(this->ImportedTargetsOwned).
                super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  aVar2.x_ = local_38.x_;
  local_38.x_ = (cmTarget *)0x0;
  cmsys::auto_ptr<cmTarget>::~auto_ptr(&local_38);
  return aVar2.x_;
}

Assistant:

cmTarget*
cmMakefile::AddImportedTarget(const std::string& name,
                              cmTarget::TargetType type,
                              bool global)
{
  // Create the target.
  cmsys::auto_ptr<cmTarget> target(new cmTarget);
  target->SetType(type, name);
  target->MarkAsImported();
  target->SetMakefile(this);

  // Add to the set of available imported targets.
  this->ImportedTargets[name] = target.get();
  if(global)
    {
    this->GetGlobalGenerator()->AddTarget(target.get());
    }

  // Transfer ownership to this cmMakefile object.
  this->ImportedTargetsOwned.push_back(target.get());
  return target.release();
}